

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

void __thiscall
testing::internal::GTestLog::GTestLog(GTestLog *this,GTestLogSeverity severity,char *file,int line)

{
  char *pcVar1;
  ostream *poVar2;
  int line_00;
  char *pcVar3;
  char *pcVar4;
  string local_40;
  
  this->severity_ = severity;
  pcVar3 = "[ FATAL ]";
  if (severity == GTEST_ERROR) {
    pcVar3 = "[ ERROR ]";
  }
  pcVar1 = "[WARNING]";
  if (severity != GTEST_WARNING) {
    pcVar1 = pcVar3;
  }
  pcVar4 = "[  INFO ]";
  if (severity != GTEST_INFO) {
    pcVar4 = pcVar1;
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  line_00 = (int)pcVar3;
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," ");
  FormatFileLocation_abi_cxx11_(&local_40,(internal *)file,(char *)(ulong)(uint)line,line_00);
  poVar2 = std::operator<<(poVar2,local_40._M_dataplus._M_p);
  std::operator<<(poVar2,": ");
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

GTestLog::GTestLog(GTestLogSeverity severity, const char* file, int line)
    : severity_(severity) {
  const char* const marker =
      severity == GTEST_INFO ?    "[  INFO ]" :
      severity == GTEST_WARNING ? "[WARNING]" :
      severity == GTEST_ERROR ?   "[ ERROR ]" : "[ FATAL ]";
  GetStream() << ::std::endl << marker << " "
              << FormatFileLocation(file, line).c_str() << ": ";
}